

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServiceRequestPdu.cpp
# Opt level: O0

void __thiscall DIS::ServiceRequestPdu::marshal(ServiceRequestPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_40 [8];
  SupplyQuantity x;
  size_t idx;
  DataStream *dataStream_local;
  ServiceRequestPdu *this_local;
  
  LogisticsFamilyPdu::marshal(&this->super_LogisticsFamilyPdu,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  EntityID::marshal(&this->_servicingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_serviceTypeRequested);
  sVar2 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::size
                    (&this->_supplies);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_serviceRequestPadding);
  x._quantity = 0.0;
  x._28_4_ = 0;
  while( true ) {
    uVar1 = x._24_8_;
    sVar2 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::size
                      (&this->_supplies);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>::operator[]
                       (&this->_supplies,x._24_8_);
    SupplyQuantity::SupplyQuantity((SupplyQuantity *)local_40,pvVar3);
    SupplyQuantity::marshal((SupplyQuantity *)local_40,dataStream);
    SupplyQuantity::~SupplyQuantity((SupplyQuantity *)local_40);
    x._24_8_ = x._24_8_ + 1;
  }
  return;
}

Assistant:

void ServiceRequestPdu::marshal(DataStream& dataStream) const
{
    LogisticsFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _requestingEntityID.marshal(dataStream);
    _servicingEntityID.marshal(dataStream);
    dataStream << _serviceTypeRequested;
    dataStream << ( unsigned char )_supplies.size();
    dataStream << _serviceRequestPadding;

     for(size_t idx = 0; idx < _supplies.size(); idx++)
     {
        SupplyQuantity x = _supplies[idx];
        x.marshal(dataStream);
     }

}